

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O1

UINT8 DROPlayer::PlayerCanLoadFile(DATA_LOADER *dataLoader)

{
  UINT8 UVar1;
  UINT32 UVar2;
  long *plVar3;
  
  DataLoader_ReadUntil(dataLoader,0x10);
  UVar2 = DataLoader_GetSize(dataLoader);
  UVar1 = 0xf1;
  if (0xf < UVar2) {
    plVar3 = (long *)DataLoader_GetData(dataLoader);
    UVar1 = (*plVar3 == 0x4c504f5741524244) * '\x10' + 0xf0;
  }
  return UVar1;
}

Assistant:

UINT8 DROPlayer::PlayerCanLoadFile(DATA_LOADER *dataLoader)
{
	DataLoader_ReadUntil(dataLoader,0x10);
	if (DataLoader_GetSize(dataLoader) < 0x10)
		return 0xF1;	// file too small
	if (memcmp(&DataLoader_GetData(dataLoader)[0x00], "DBRAWOPL", 8))
		return 0xF0;	// invalid signature
	return 0x00;
}